

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCascade.c
# Opt level: O2

int Abc_ResMigrate(DdManager *dd,DdNode *bFunc,int nInputs,uint *uParts,int iPart1,int iPart2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int local_6c;
  uint local_68;
  uint local_64;
  
  local_64 = uParts[iPart1];
  local_68 = uParts[iPart2];
  if ((local_68 & local_64) == 0) {
    iVar1 = Abc_ResCost(dd,bFunc,local_64,(int *)0x0,(int *)0x0);
    iVar2 = Abc_ResCost(dd,bFunc,uParts[iPart2],(int *)0x0,(int *)0x0);
    uVar6 = 0;
    uVar3 = 0;
    if (0 < nInputs) {
      uVar3 = nInputs;
    }
    local_6c = 0;
    for (; uVar6 != uVar3; uVar6 = uVar6 + 1) {
      if ((uParts[iPart1] >> (uVar6 & 0x1f) & 1) != 0) {
        for (uVar7 = 0; nInputs != uVar7; uVar7 = uVar7 + 1) {
          uVar8 = 1 << ((byte)uVar7 & 0x1f);
          if ((uVar6 != uVar7) && ((uParts[iPart2] & uVar8) != 0)) {
            uVar8 = uVar8 | 1 << ((byte)uVar6 & 0x1f);
            uParts[iPart1] = uParts[iPart1] ^ uVar8;
            uParts[iPart2] = uParts[iPart2] ^ uVar8;
            iVar4 = Abc_ResCost(dd,bFunc,uParts[iPart1],(int *)0x0,(int *)0x0);
            iVar5 = Abc_ResCost(dd,bFunc,uParts[iPart2],(int *)0x0,(int *)0x0);
            if (iVar5 + iVar4 < iVar2 + iVar1) {
              local_68 = uParts[iPart2];
              local_6c = 1;
              local_64 = uParts[iPart1];
            }
            uParts[iPart1] = uParts[iPart1] ^ uVar8;
            uParts[iPart2] = uParts[iPart2] ^ uVar8;
          }
        }
      }
    }
    uParts[iPart1] = local_64;
    uParts[iPart2] = local_68;
    return local_6c;
  }
  __assert_fail("(uParts[iPart1] & uParts[iPart2]) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCascade.c"
                ,0x13f,"int Abc_ResMigrate(DdManager *, DdNode *, int, unsigned int *, int, int)");
}

Assistant:

int Abc_ResMigrate( DdManager * dd, DdNode * bFunc, int nInputs, unsigned uParts[], int iPart1, int iPart2 )
{
    unsigned uParts2[2] = { uParts[iPart1], uParts[iPart2] };
    int i, k, CostCur, CostBest, fChange = 0;
    assert( (uParts[iPart1] & uParts[iPart2]) == 0 );
    CostBest = Abc_ResCost( dd, bFunc, uParts[iPart1], NULL, NULL ) 
             + Abc_ResCost( dd, bFunc, uParts[iPart2], NULL, NULL );
    for ( i = 0; i < nInputs; i++ )
    if ( uParts[iPart1] & (1 << i) )
    {
        for ( k = 0; k < nInputs; k++ )
        if ( uParts[iPart2] & (1 << k) )
        {
            if ( i == k )
                continue;
            uParts[iPart1] ^= (1 << i) | (1 << k);
            uParts[iPart2] ^= (1 << i) | (1 << k);
            CostCur = Abc_ResCost( dd, bFunc, uParts[iPart1], NULL, NULL ) + Abc_ResCost( dd, bFunc, uParts[iPart2], NULL, NULL );
            if ( CostCur < CostBest )
            {
                CostCur    = CostBest;
                uParts2[0] = uParts[iPart1];
                uParts2[1] = uParts[iPart2];
                fChange = 1;
            }
            uParts[iPart1] ^= (1 << i) | (1 << k);
            uParts[iPart2] ^= (1 << i) | (1 << k);
        }
    }
    uParts[iPart1] = uParts2[0];
    uParts[iPart2] = uParts2[1];
    return fChange;
}